

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall
ON_3dmAnnotationSettings::SetDimensionLayerId
          (ON_3dmAnnotationSettings *this,ON_UUID *dimension_layer_id)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  bool bVar3;
  ON_3dmAnnotationSettingsPrivate *pOVar4;
  ON_UUID local_28;
  ON_UUID_struct *local_18;
  ON_UUID *dimension_layer_id_local;
  ON_3dmAnnotationSettings *this_local;
  
  if (this != &Default) {
    local_18 = dimension_layer_id;
    dimension_layer_id_local = (ON_UUID *)this;
    local_28 = DimensionLayerId(this);
    bVar3 = ::operator!=(&local_28,local_18);
    if (bVar3) {
      if (this->m_private == (ON_3dmAnnotationSettingsPrivate *)0x0) {
        pOVar4 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
        memset(pOVar4,0,0x1c);
        ON_3dmAnnotationSettingsPrivate::ON_3dmAnnotationSettingsPrivate(pOVar4);
        this->m_private = pOVar4;
      }
      pOVar4 = this->m_private;
      uVar1 = local_18->Data2;
      uVar2 = local_18->Data3;
      (pOVar4->m_dimension_layer_id).Data1 = local_18->Data1;
      (pOVar4->m_dimension_layer_id).Data2 = uVar1;
      (pOVar4->m_dimension_layer_id).Data3 = uVar2;
      *(undefined8 *)(pOVar4->m_dimension_layer_id).Data4 = *(undefined8 *)local_18->Data4;
    }
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::SetDimensionLayerId(const ON_UUID& dimension_layer_id)
{
  if (this == &ON_3dmAnnotationSettings::Default)
    return;
  if (DimensionLayerId() != dimension_layer_id)
  {
    if (nullptr == m_private)
      m_private = new ON_3dmAnnotationSettingsPrivate();
    m_private->m_dimension_layer_id = dimension_layer_id;
  }
}